

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O2

void __thiscall duckdb::AttachOptions::AttachOptions(AttachOptions *this,DBConfigOptions *options)

{
  this->access_mode = options->access_mode;
  ::std::__cxx11::string::string((string *)&this->db_type,(string *)&options->database_type);
  (this->options)._M_h._M_buckets = &(this->options)._M_h._M_single_bucket;
  (this->options)._M_h._M_bucket_count = 1;
  (this->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options)._M_h._M_element_count = 0;
  (this->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  QualifiedName::QualifiedName(&this->default_table);
  return;
}

Assistant:

AttachOptions::AttachOptions(const DBConfigOptions &options)
    : access_mode(options.access_mode), db_type(options.database_type) {
}